

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__02_Writer.cpp
# Opt level: O0

void __thiscall
AS_02::MXF::AS02IndexWriterVBR::AS02IndexWriterVBR(AS02IndexWriterVBR *this,Dictionary *d)

{
  Dictionary *d_local;
  AS02IndexWriterVBR *this_local;
  
  ASDCP::MXF::Partition::Partition(&this->super_Partition,d);
  *(undefined ***)this = &PTR__AS02IndexWriterVBR_001eeeb0;
  this->m_CurrentSegment = (IndexTableSegment *)0x0;
  ASDCP::MXF::Rational::Rational(&this->m_EditRate);
  this->m_Dict = d;
  this->m_Lookup = (IPrimerLookup *)0x0;
  *(undefined4 *)&this->field_0xc0 = 0;
  *(undefined4 *)&this->field_0xb0 = 0x81;
  *(undefined2 *)&this->field_0x82 = 3;
  return;
}

Assistant:

AS_02::MXF::AS02IndexWriterVBR::AS02IndexWriterVBR(const ASDCP::Dictionary* d) :
  Partition(d), m_CurrentSegment(0), m_Dict(d), m_Lookup(0)
{
  BodySID = 0;
  IndexSID = 129;
  MinorVersion = 3;
}